

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_playback.c
# Opt level: O0

void decode_alcGetEnumValue(void)

{
  ALCenum retval_00;
  ALCdevice *device_00;
  char *enumname_00;
  ALCenum retval;
  ALCchar *enumname;
  ALCdevice *device;
  CallerInfo callerinfo;
  
  IO_ENTRYINFO((CallerInfo *)&device);
  if (io_failure == 0) {
    device_00 = (ALCdevice *)IO_PTR();
    enumname_00 = IO_STRING();
    retval_00 = IO_ALCENUM();
    if (io_failure == 0) {
      visit_alcGetEnumValue((CallerInfo *)&device,retval_00,device_00,enumname_00);
    }
  }
  return;
}

Assistant:

static void decode_alcGetEnumValue(void)
{
    IO_START(alcGetEnumValue);
    ALCdevice *device = (ALCdevice *) IO_PTR();
    const ALCchar *enumname = (const ALCchar *) IO_STRING();
    const ALCenum retval = IO_ALCENUM();
    if (!io_failure) visit_alcGetEnumValue(&callerinfo, retval, device, enumname);
    IO_END();
}